

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopTest.cpp
# Opt level: O3

int main(void)

{
  TimeStamp *__dest;
  undefined1 local_110 [8];
  EventLoop event_loop;
  
  higan::EventLoop::EventLoop((EventLoop *)local_110);
  event_loop.timer_manager_.min_expire_time.microsecond_time_ = (int64_t)PendingFunc;
  g_event_loop = (EventLoop *)local_110;
  higan::EventLoop::RunInLoop
            ((EventLoop *)local_110,(EventLoopFunc *)&event_loop.timer_manager_.min_expire_time);
  __dest = &event_loop.timer_manager_.min_expire_time;
  std::_Function_handler<void_(),_void_(*)()>::_M_manager
            ((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  higan::EventLoop::Loop((EventLoop *)local_110);
  higan::EventLoop::~EventLoop((EventLoop *)local_110);
  return 0;
}

Assistant:

int main()
{

	higan::EventLoop event_loop;
	g_event_loop = &event_loop;

	event_loop.RunInLoop(PendingFunc);
	event_loop.Loop();
}